

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
TestSchema::readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  int32_t iVar1;
  ostream *poVar2;
  Parser<avro::ReaderImpl<avro::Validator>_> *in_RDI;
  TestSchema *unaff_retaddr;
  int32_t intval;
  string key;
  int64_t i;
  int64_t size;
  string *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  string local_40 [32];
  long local_20;
  long local_18;
  
  local_18 = 0;
  do {
    printNext(unaff_retaddr,in_RDI);
    local_18 = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readMapBlockSize
                         ((Parser<avro::ReaderImpl<avro::Validator>_> *)0x2b4c4a);
    poVar2 = std::operator<<((ostream *)&std::cout,"Size ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    std::operator<<(poVar2,'\n');
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      std::__cxx11::string::string(local_40);
      printNext(unaff_retaddr,in_RDI);
      avro::Parser<avro::ReaderImpl<avro::Validator>_>::readString
                ((Parser<avro::ReaderImpl<avro::Validator>_> *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      printNext(unaff_retaddr,in_RDI);
      iVar1 = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readInt
                        ((Parser<avro::ReaderImpl<avro::Validator>_> *)in_stack_ffffffffffffff90);
      poVar2 = std::operator<<((ostream *)&std::cout,local_40);
      in_stack_ffffffffffffff90 = std::operator<<(poVar2,":");
      in_stack_ffffffffffffff88 =
           (string *)std::ostream::operator<<(in_stack_ffffffffffffff90,iVar1);
      std::operator<<((ostream *)in_stack_ffffffffffffff88,'\n');
      std::__cxx11::string::~string(local_40);
    }
  } while (local_18 != 0);
  return;
}

Assistant:

void readMap(Parser &p)
    {
        int64_t size = 0;
        do { 
            printNext(p);
            size = p.readMapBlockSize();
            std::cout << "Size " << size << '\n';
            for(int64_t i=0; i < size; ++i) {
                std::string key;
                printNext(p);
                p.readString(key);
                printNext(p);
                int32_t intval = p.readInt();
                std::cout << key << ":" << intval << '\n';
            }
        } while (size != 0);
    }